

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListWindow.cpp
# Opt level: O2

void __thiscall cursespp::ListWindow::ScrollUp(ListWindow *this,int delta)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  uint uVar3;
  ulong uVar4;
  
  iVar1 = (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
            _vptr_IOrderable[0x42])();
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
                    ((long *)CONCAT44(extraout_var,iVar1));
  if (lVar2 != 0) {
    iVar1 = (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
              _vptr_IOrderable[0x41])(this);
    uVar3 = (int)this->selectedIndex - delta;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = 0;
    }
    uVar3 = (int)uVar4 - 1;
    if ((int)*(uint *)CONCAT44(extraout_var_00,iVar1) < (int)uVar4) {
      uVar3 = *(uint *)CONCAT44(extraout_var_00,iVar1);
    }
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = 0;
    }
    (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
      [0x46])(this);
    (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
      [0x44])(this,uVar4);
    return;
  }
  return;
}

Assistant:

void ListWindow::ScrollUp(int delta) {
    IScrollAdapter& adapter = this->GetScrollAdapter();

    if (adapter.GetEntryCount() > 0) {
        ScrollPos spos = this->GetScrollPosition();

        size_t first = spos.firstVisibleEntryIndex;
        size_t last = first + spos.visibleEntryCount;
        int drawIndex = (int) first;

        int minIndex = 0;
        int newIndex = (int) this->selectedIndex - delta;
        newIndex = std::max(newIndex, minIndex);

        if (newIndex < (int)first + 1) {
            drawIndex = newIndex - 1;
        }

        drawIndex = std::max(0, drawIndex);

        this->SetSelectedIndex(newIndex);
        this->ScrollTo(drawIndex);
    }
}